

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::ConeRecord1::ConeRecord1
          (ConeRecord1 *this,KUINT8 Index,WorldCoordinates *VertexLocation,EulerAngles *Orientation,
          KFLOAT32 Height,KFLOAT32 PeakAngle)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ConeRecord1_002160a0;
  (this->m_Loc).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00214d08;
  KVar1 = VertexLocation->m_f64Y;
  (this->m_Loc).m_f64X = VertexLocation->m_f64X;
  (this->m_Loc).m_f64Y = KVar1;
  (this->m_Loc).m_f64Z = VertexLocation->m_f64Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00215f88;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  this->m_f32Height = Height;
  this->m_f32PeakAngle = PeakAngle;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x300000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

ConeRecord1::ConeRecord1( KUINT8 Index, const WorldCoordinates & VertexLocation, const EulerAngles & Orientation,
                          KFLOAT32 Height, KFLOAT32 PeakAngle ) :
    m_Loc( VertexLocation ),
    m_Ori( Orientation ),
    m_f32Height( Height ),
    m_f32PeakAngle( PeakAngle ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = ConeRecord1Type;
    m_ui16Length = ( CONE_RECORD_1_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}